

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::write_decimal<unsigned_int>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *this,uint value)

{
  ulong uVar1;
  basic_buffer<char> *pbVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  undefined1 *puVar6;
  byte bVar7;
  long lVar8;
  uint uVar9;
  ptrdiff_t _Num;
  ulong __n;
  undefined1 local_35 [13];
  
  uVar9 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar9 = (uVar9 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  __n = (ulong)((uVar9 - (value < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                           (ulong)uVar9 * 4))) + 1);
  pbVar2 = (this->out_).container;
  sVar3 = pbVar2->size_;
  uVar1 = sVar3 + __n;
  if (pbVar2->capacity_ < uVar1) {
    (**pbVar2->_vptr_basic_buffer)(pbVar2,uVar1);
  }
  pbVar2->size_ = uVar1;
  puVar6 = local_35 + __n;
  uVar9 = value;
  if (99 < value) {
    do {
      value = uVar9 / 100;
      *(undefined2 *)(puVar6 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar9 % 100) * 2);
      puVar6 = puVar6 + -2;
      bVar5 = 9999 < uVar9;
      uVar9 = uVar9 / 100;
    } while (bVar5);
  }
  pcVar4 = pbVar2->ptr_;
  if (value < 10) {
    bVar7 = (byte)value | 0x30;
    lVar8 = -1;
  }
  else {
    puVar6[-1] = internal::basic_data<void>::DIGITS[((ulong)value * 2 & 0xffffffff) + 1];
    bVar7 = internal::basic_data<void>::DIGITS[(ulong)value * 2];
    lVar8 = -2;
  }
  puVar6[lVar8] = bVar7;
  if (__n != 0) {
    memcpy(pcVar4 + sVar3,local_35,__n);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }